

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> * __thiscall
Catch::TestRegistry::getAllTestsSorted(TestRegistry *this,IConfig *config)

{
  TestRunOrder TVar1;
  TestRunOrder TVar2;
  _Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_40;
  
  if ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    enforceNoDuplicateTestCases(&this->m_handles);
  }
  TVar2 = this->m_currentSortOrder;
  TVar1 = (*config->_vptr_IConfig[0x10])(config);
  if ((TVar2 != TVar1) ||
     ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    sortTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)&local_40,
              config,&this->m_handles);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::_M_move_assign
              (&this->m_sortedFunctions,&local_40);
    std::_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::~_Vector_base
              (&local_40);
    TVar2 = (*config->_vptr_IConfig[0x10])(config);
    this->m_currentSortOrder = TVar2;
  }
  return &this->m_sortedFunctions;
}

Assistant:

std::vector<TestCaseHandle> const &TestRegistry::getAllTestsSorted(IConfig const &config) const {
        if (m_sortedFunctions.empty())
            enforceNoDuplicateTestCases(m_handles);

        if (m_currentSortOrder != config.runOrder() || m_sortedFunctions.empty()) {
            m_sortedFunctions = sortTests(config, m_handles);
            m_currentSortOrder = config.runOrder();
        }
        return m_sortedFunctions;
    }